

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict sexp_stat_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  stat *__buf;
  sexp_conflict psVar2;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    local_38.var = &local_40;
    local_38.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_38;
    __buf = (stat *)calloc(1,0x91);
    iVar1 = stat((((arg0->value).type.cpl)->value).flonum_bits +
                 (long)(((arg0->value).type.name)->value).flonum_bits,__buf);
    psVar2 = (sexp_conflict)0x3e;
    if (iVar1 == 0) {
      psVar2 = (sexp_conflict)
               sexp_make_cpointer(ctx,(long)(self->value).type.print >> 1,__buf,0x3e,1);
    }
    (ctx->value).context.saves = local_38.next;
    return psVar2;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,9,arg0);
  return psVar2;
}

Assistant:

sexp sexp_stat_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  struct stat* tmp1;
  sexp res;
  sexp_gc_var1(res1);
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  sexp_gc_preserve1(ctx, res1);
  tmp1 = (struct stat*) calloc(1, 1 + sizeof(tmp1[0]));
  err = stat(sexp_string_data(arg0), tmp1);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, SEXP_FALSE, 1);
  res = res1;
  }
  sexp_gc_release1(ctx);
  return res;
}